

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# ImfStringAttribute.cpp
# Opt level: O1

void __thiscall
Imf_3_4::
TypedAttribute<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>::
readValueFrom(TypedAttribute<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
              *this,IStream *is,int size,int version)

{
  ulong uVar1;
  
  std::__cxx11::string::resize((ulong)&this->_value,(char)size);
  if (0 < size) {
    uVar1 = 0;
    do {
      (*is->_vptr_IStream[3])(is,(this->_value)._M_dataplus._M_p + uVar1,1);
      uVar1 = uVar1 + 1;
    } while ((uint)size != uVar1);
  }
  return;
}

Assistant:

IMF_EXPORT void
TypedAttribute<std::string>::readValueFrom (
    OPENEXR_IMF_INTERNAL_NAMESPACE::IStream& is, int size, int version)
{
    _value.resize (size);

    for (int i = 0; i < size; i++)
        Xdr::read<StreamIO> (is, _value[i]);
}